

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseObject<160u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  bool bVar1;
  Ch CVar2;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDX;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_RSI;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDI;
  SizeType memberCount;
  bool in_stack_0000006f;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_stack_00000070;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_stack_00000078;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
  *in_stack_00000080;
  ParseErrorCode in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar3;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_00;
  
  this_00 = in_RDI;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
            ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)in_RDI);
  bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::StartObject((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                         *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)in_RDI,in_stack_ffffffffffffffac,0x23f83d);
    bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x23f849);
    if (bVar1) {
      return;
    }
  }
  SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>
            ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *
             )CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)in_RDI);
  bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)0x23f877);
  if (!bVar1) {
    CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek(in_RSI);
    if (CVar2 == '}') {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)in_RDI);
      bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::EndObject(this_00,(SizeType)((ulong)in_RSI >> 0x20));
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       *)in_RDI,in_stack_ffffffffffffffac,0x23f90b);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       *)0x23f917);
      }
    }
    else {
      iVar3 = 0;
      do {
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (in_RSI);
        if (CVar2 != '\"') {
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)in_RDI,in_stack_ffffffffffffffac,0x23f976);
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x23f982);
          if (bVar1) {
            return;
          }
        }
        ParseString<160u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_0000006f);
        bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x23f9ba);
        if (bVar1) {
          return;
        }
        SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>
                  ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    *)CONCAT44(iVar3,in_stack_ffffffffffffffb8),
                   (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)in_RDI
                  );
        bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x23f9e4);
        if (bVar1) {
          return;
        }
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (in_RSI);
        if (CVar2 == ':') {
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                    ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                     in_RDI);
        }
        else {
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)in_RDI,in_stack_ffffffffffffffac,0x23fa67);
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x23fa73);
          if (bVar1) {
            return;
          }
        }
        SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>
                  ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    *)CONCAT44(iVar3,in_stack_ffffffffffffffb8),
                   (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)in_RDI
                  );
        bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x23faa1);
        if (bVar1) {
          return;
        }
        ParseValue<160u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (in_RDX,(BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *
                          )CONCAT44(iVar3,in_stack_ffffffffffffffb8),in_RDI);
        bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x23fad0);
        if (bVar1) {
          return;
        }
        SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>
                  ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    *)CONCAT44(iVar3,in_stack_ffffffffffffffb8),
                   (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)in_RDI
                  );
        bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x23fafa);
        if (bVar1) {
          return;
        }
        iVar3 = iVar3 + 1;
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (in_RSI);
        in_stack_ffffffffffffffac = (ParseErrorCode)CVar2;
        if (in_stack_ffffffffffffffac == 0x2c) {
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                    ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                     in_RDI);
          SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>
                    ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                      *)CONCAT44(iVar3,in_stack_ffffffffffffffb8),
                     (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                     in_RDI);
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x23fb5e);
          if (bVar1) {
            return;
          }
        }
        else {
          if (in_stack_ffffffffffffffac == 0x7d) {
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                      ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                       in_RDI);
            bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::EndObject(this_00,(SizeType)((ulong)in_RSI >> 0x20));
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              return;
            }
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)in_RDI,in_stack_ffffffffffffffac,0x23fbb8);
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x23fbc4);
            return;
          }
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)in_RDI,in_stack_ffffffffffffffac,0x23fbfe);
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x23fc0a);
          if (bVar1) {
            return;
          }
        }
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (in_RSI);
      } while (CVar2 != '}');
      bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::EndObject(this_00,(SizeType)((ulong)in_RSI >> 0x20));
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       *)in_RDI,in_stack_ffffffffffffffac,0x23fc6b);
        bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x23fc77);
        if (bVar1) {
          return;
        }
      }
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)in_RDI);
    }
  }
  return;
}

Assistant:

void ParseObject(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '{');
        is.Take();  // Skip '{'

        if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, '}')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndObject(0)))  // empty object
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType memberCount = 0;;) {
            if (RAPIDJSON_UNLIKELY(is.Peek() != '"'))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissName, is.Tell());

            ParseString<parseFlags>(is, handler, true);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (RAPIDJSON_UNLIKELY(!Consume(is, ':')))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissColon, is.Tell());

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++memberCount;

            switch (is.Peek()) {
                case ',':
                    is.Take();
                    SkipWhitespaceAndComments<parseFlags>(is);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    break;
                case '}':
                    is.Take();
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    return;
                default:
                    RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissCommaOrCurlyBracket, is.Tell()); break; // This useless break is only for making warning and coverage happy
            }

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == '}') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }